

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

bool __thiscall Game::checkValidCard(Game *this,size_t playerID,Card firstCard,Card newCard)

{
  pointer pvVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  ulong uVar5;
  value_type cards;
  Card local_40;
  Card local_38;
  vector<Card,_std::allocator<Card>_> local_30;
  
  pvVar1 = (this->m_playerCards).
           super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->m_playerCards).
                 super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  local_40 = newCard;
  local_38 = firstCard;
  if (playerID <= uVar5 && uVar5 - playerID != 0) {
    std::vector<Card,_std::allocator<Card>_>::vector(&local_30,pvVar1 + playerID);
    bVar2 = hasCard(this,playerID,local_40);
    if (bVar2) {
      bVar3 = Ruleset::isSameType(&this->m_rules,&local_38,&local_40);
      bVar2 = true;
      if (!bVar3) {
        bVar2 = Ruleset::containsType(&this->m_rules,&local_30,&local_38);
        bVar2 = !bVar2;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return bVar2;
  }
  uVar4 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     playerID);
  if (local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

bool Game::checkValidCard(size_t playerID, Card firstCard, Card newCard) {
    auto cards = m_playerCards.at(playerID);
    //Card available?
    if (!hasCard(playerID, newCard)) return false;
    //served ?
    if (m_rules.isSameType(firstCard, newCard)) return true;
        //no need to serve?
    else if (m_rules.containsType(cards, firstCard)) return false;
    return true;
}